

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

LineParametersWithConfidence *
deqp::gles3::Performance::anon_unknown_1::
fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          (LineParametersWithConfidence *__return_storage_ptr__,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
          *samples,int beginNdx,int endNdx,int step,
          offset_in_SingleOperationDuration_to_deUint64 target)

{
  pointer pUVar1;
  LineParametersWithConfidence *pLVar2;
  int sampleNdx;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> samplePoints;
  value_type local_58;
  LineParametersWithConfidence *local_50;
  _Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = __return_storage_ptr__;
  for (; pLVar2 = local_50, beginNdx < endNdx; beginNdx = beginNdx + step) {
    pUVar1 = (samples->
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_58.m_data[0] = (float)pUVar1[beginNdx].writtenSize;
    local_58.m_data[1] = (float)pUVar1[beginNdx].duration.fitResponseDuration;
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)&local_48,
               &local_58);
  }
  deqp::gls::theilSenSiegelLinearRegression
            (local_50,(vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                      &local_48,0.6);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&local_48);
  return pLVar2;
}

Assistant:

static LineParametersWithConfidence fitLineToSamples (const std::vector<UploadSampleResult<DurationType> >& samples, int beginNdx, int endNdx, int step, deUint64 DurationType::*target = &DurationType::fitResponseDuration)
{
	std::vector<tcu::Vec2> samplePoints;

	for (int sampleNdx = beginNdx; sampleNdx < endNdx; sampleNdx += step)
	{
		tcu::Vec2 point;

		point.x() = (float)(samples[sampleNdx].writtenSize);
		point.y() = (float)(samples[sampleNdx].duration.*target);

		samplePoints.push_back(point);
	}

	return theilSenSiegelLinearRegression(samplePoints, 0.6f);
}